

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedColorMasks.cpp
# Opt level: O2

void __thiscall
glcts::DrawBuffersIndexedColorMasks::releaseFramebuffer(DrawBuffersIndexedColorMasks *this)

{
  int iVar1;
  undefined4 extraout_var;
  ResourceError *this_00;
  GLenum bufs [1];
  GLint maxDrawBuffers;
  BlendMaskStateMachine state;
  long lVar2;
  
  iVar1 = (*((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  maxDrawBuffers = 0;
  (**(code **)(lVar2 + 0x868))(0x8824,&maxDrawBuffers);
  if (3 < maxDrawBuffers) {
    DrawBuffersIndexedBase::BlendMaskStateMachine::BlendMaskStateMachine
              (&state,(this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context,
               ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                super_TestNode.m_testCtx)->m_log,maxDrawBuffers);
    DrawBuffersIndexedBase::BlendMaskStateMachine::SetDefaults(&state);
    (**(code **)(lVar2 + 0x440))(1,&this->m_fbo);
    (**(code **)(lVar2 + 0x78))(0x8d40,0);
    bufs[0] = 0x405;
    (**(code **)(lVar2 + 0x560))(1);
    (**(code **)(lVar2 + 0x1218))(0x405);
    std::
    _Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
    ::~_Vector_base((_Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                     *)&state);
    return;
  }
  this_00 = (ResourceError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&state,"Minimum number of draw buffers too low",(allocator<char> *)bufs);
  tcu::ResourceError::ResourceError(this_00,(string *)&state);
  __cxa_throw(this_00,&tcu::ResourceError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void DrawBuffersIndexedColorMasks::releaseFramebuffer()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint maxDrawBuffers = 0;
	gl.getIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	if (maxDrawBuffers < 4)
	{
		throw tcu::ResourceError("Minimum number of draw buffers too low");
	}

	BlendMaskStateMachine state(m_context, m_testCtx.getLog(), maxDrawBuffers);
	state.SetDefaults();
	gl.deleteFramebuffers(1, &m_fbo);
	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	glw::GLenum bufs[1] = { GL_BACK };
	gl.drawBuffers(1, bufs);
	gl.readBuffer(GL_BACK);
}